

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_tests.c
# Opt level: O0

char * AllUpper(char *arr)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDI;
  int i;
  char *res;
  size_t len;
  int local_1c;
  
  sVar2 = strlen(in_RDI);
  pcVar3 = (char *)operator_new__(sVar2 + 1);
  for (local_1c = 0; ((ulong)(long)local_1c < sVar2 && (in_RDI[local_1c] != '\0'));
      local_1c = local_1c + 1) {
    iVar1 = toupper((int)in_RDI[local_1c]);
    pcVar3[local_1c] = (char)iVar1;
  }
  pcVar3[sVar2] = '\0';
  return pcVar3;
}

Assistant:

char* AllUpper(char* arr)
{
	auto len = strlen(arr);
	char* res = new char[len + 1];
	for(auto i = 0; i < len; i++)
	{
		if(arr[i] == '\0')
			break;
		res[i] = toupper(arr[i]);
	}
	res[len] = 0;
	return res;
}